

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5IndexPrepareStmt(Fts5Index *p,sqlite3_stmt **ppStmt,char *zSql)

{
  int iVar1;
  int iVar2;
  
  if (p->rc == 0) {
    if (zSql == (char *)0x0) {
      iVar2 = 7;
    }
    else {
      iVar1 = sqlite3LockAndPrepare(p->pConfig->db,zSql,-1,0x85,(Vdbe *)0x0,ppStmt,(char **)0x0);
      iVar2 = 0xb;
      if (iVar1 != 1) {
        iVar2 = iVar1;
      }
    }
    p->rc = iVar2;
  }
  sqlite3_free(zSql);
  return p->rc;
}

Assistant:

static int fts5IndexPrepareStmt(
  Fts5Index *p,
  sqlite3_stmt **ppStmt,
  char *zSql
){
  if( p->rc==SQLITE_OK ){
    if( zSql ){
      int rc = sqlite3_prepare_v3(p->pConfig->db, zSql, -1,
          SQLITE_PREPARE_PERSISTENT|SQLITE_PREPARE_NO_VTAB,
          ppStmt, 0);
      /* If this prepare() call fails with SQLITE_ERROR, then one of the
      ** %_idx or %_data tables has been removed or modified. Call this
      ** corruption.  */
      p->rc = (rc==SQLITE_ERROR ? SQLITE_CORRUPT : rc);
    }else{
      p->rc = SQLITE_NOMEM;
    }
  }
  sqlite3_free(zSql);
  return p->rc;
}